

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O0

void __thiscall DisasmReplayer::~DisasmReplayer(DisasmReplayer *this)

{
  PFN_vkDestroyDescriptorSetLayout p_Var1;
  PFN_vkDestroyPipeline p_Var2;
  PFN_vkDestroyPipelineCache p_Var3;
  PFN_vkDestroyPipelineLayout p_Var4;
  PFN_vkDestroyRenderPass p_Var5;
  PFN_vkDestroySampler p_Var6;
  PFN_vkDestroyShaderModule p_Var7;
  bool bVar8;
  VkDevice pVVar9;
  reference ppVVar10;
  reference ppVVar11;
  reference ppVVar12;
  reference ppVVar13;
  reference ppVVar14;
  reference ppVVar15;
  VkPipeline_T **pipeline_2;
  iterator __end2_7;
  iterator __begin2_7;
  vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_> *__range2_7;
  VkPipeline_T **pipeline_1;
  iterator __end2_6;
  iterator __begin2_6;
  vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_> *__range2_6;
  VkPipeline_T **pipeline;
  iterator __end2_5;
  iterator __begin2_5;
  vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_> *__range2_5;
  VkRenderPass_T **render_pass;
  iterator __end2_4;
  iterator __begin2_4;
  vector<VkRenderPass_T_*,_std::allocator<VkRenderPass_T_*>_> *__range2_4;
  VkShaderModule_T **shader_module;
  iterator __end2_3;
  iterator __begin2_3;
  vector<VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>_> *__range2_3;
  VkPipelineLayout_T **pipeline_layout;
  iterator __end2_2;
  iterator __begin2_2;
  vector<VkPipelineLayout_T_*,_std::allocator<VkPipelineLayout_T_*>_> *__range2_2;
  VkDescriptorSetLayout_T **layout;
  iterator __end2_1;
  iterator __begin2_1;
  vector<VkDescriptorSetLayout_T_*,_std::allocator<VkDescriptorSetLayout_T_*>_> *__range2_1;
  VkSampler_T **sampler;
  iterator __end2;
  iterator __begin2;
  vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_> *__range2;
  DisasmReplayer *this_local;
  
  (this->super_StateCreatorInterface)._vptr_StateCreatorInterface =
       (_func_int **)&PTR__DisasmReplayer_0080c570;
  p_Var3 = vkDestroyPipelineCache;
  if (this->device != (VulkanDevice *)0x0) {
    if (this->pipeline_cache != (VkPipelineCache)0x0) {
      pVVar9 = Fossilize::VulkanDevice::get_device(this->device);
      (*p_Var3)(pVVar9,this->pipeline_cache,(VkAllocationCallbacks *)0x0);
    }
    __end2 = std::vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>::begin(&this->samplers);
    sampler = (VkSampler_T **)
              std::vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>::end(&this->samplers);
    while (bVar8 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<VkSampler_T_**,_std::vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>_>
                                       *)&sampler), bVar8) {
      ppVVar10 = __gnu_cxx::
                 __normal_iterator<VkSampler_T_**,_std::vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>_>
                 ::operator*(&__end2);
      p_Var6 = vkDestroySampler;
      if (*ppVVar10 != (VkSampler_T *)0x0) {
        pVVar9 = Fossilize::VulkanDevice::get_device(this->device);
        (*p_Var6)(pVVar9,*ppVVar10,(VkAllocationCallbacks *)0x0);
      }
      __gnu_cxx::
      __normal_iterator<VkSampler_T_**,_std::vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>_>
      ::operator++(&__end2);
    }
    __end2_1 = std::vector<VkDescriptorSetLayout_T_*,_std::allocator<VkDescriptorSetLayout_T_*>_>::
               begin(&this->layouts);
    layout = (VkDescriptorSetLayout_T **)
             std::vector<VkDescriptorSetLayout_T_*,_std::allocator<VkDescriptorSetLayout_T_*>_>::end
                       (&this->layouts);
    while (bVar8 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<VkDescriptorSetLayout_T_**,_std::vector<VkDescriptorSetLayout_T_*,_std::allocator<VkDescriptorSetLayout_T_*>_>_>
                               *)&layout), bVar8) {
      ppVVar11 = __gnu_cxx::
                 __normal_iterator<VkDescriptorSetLayout_T_**,_std::vector<VkDescriptorSetLayout_T_*,_std::allocator<VkDescriptorSetLayout_T_*>_>_>
                 ::operator*(&__end2_1);
      p_Var1 = vkDestroyDescriptorSetLayout;
      if (*ppVVar11 != (VkDescriptorSetLayout_T *)0x0) {
        pVVar9 = Fossilize::VulkanDevice::get_device(this->device);
        (*p_Var1)(pVVar9,*ppVVar11,(VkAllocationCallbacks *)0x0);
      }
      __gnu_cxx::
      __normal_iterator<VkDescriptorSetLayout_T_**,_std::vector<VkDescriptorSetLayout_T_*,_std::allocator<VkDescriptorSetLayout_T_*>_>_>
      ::operator++(&__end2_1);
    }
    __end2_2 = std::vector<VkPipelineLayout_T_*,_std::allocator<VkPipelineLayout_T_*>_>::begin
                         (&this->pipeline_layouts);
    pipeline_layout =
         (VkPipelineLayout_T **)
         std::vector<VkPipelineLayout_T_*,_std::allocator<VkPipelineLayout_T_*>_>::end
                   (&this->pipeline_layouts);
    while (bVar8 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<VkPipelineLayout_T_**,_std::vector<VkPipelineLayout_T_*,_std::allocator<VkPipelineLayout_T_*>_>_>
                               *)&pipeline_layout), bVar8) {
      ppVVar12 = __gnu_cxx::
                 __normal_iterator<VkPipelineLayout_T_**,_std::vector<VkPipelineLayout_T_*,_std::allocator<VkPipelineLayout_T_*>_>_>
                 ::operator*(&__end2_2);
      p_Var4 = vkDestroyPipelineLayout;
      if (*ppVVar12 != (VkPipelineLayout_T *)0x0) {
        pVVar9 = Fossilize::VulkanDevice::get_device(this->device);
        (*p_Var4)(pVVar9,*ppVVar12,(VkAllocationCallbacks *)0x0);
      }
      __gnu_cxx::
      __normal_iterator<VkPipelineLayout_T_**,_std::vector<VkPipelineLayout_T_*,_std::allocator<VkPipelineLayout_T_*>_>_>
      ::operator++(&__end2_2);
    }
    __end2_3 = std::vector<VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>_>::begin
                         (&this->shader_modules);
    shader_module =
         (VkShaderModule_T **)
         std::vector<VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>_>::end
                   (&this->shader_modules);
    while (bVar8 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<VkShaderModule_T_**,_std::vector<VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>_>_>
                               *)&shader_module), bVar8) {
      ppVVar13 = __gnu_cxx::
                 __normal_iterator<VkShaderModule_T_**,_std::vector<VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>_>_>
                 ::operator*(&__end2_3);
      p_Var7 = vkDestroyShaderModule;
      if (*ppVVar13 != (VkShaderModule_T *)0x0) {
        pVVar9 = Fossilize::VulkanDevice::get_device(this->device);
        (*p_Var7)(pVVar9,*ppVVar13,(VkAllocationCallbacks *)0x0);
      }
      __gnu_cxx::
      __normal_iterator<VkShaderModule_T_**,_std::vector<VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>_>_>
      ::operator++(&__end2_3);
    }
    __end2_4 = std::vector<VkRenderPass_T_*,_std::allocator<VkRenderPass_T_*>_>::begin
                         (&this->render_passes);
    render_pass = (VkRenderPass_T **)
                  std::vector<VkRenderPass_T_*,_std::allocator<VkRenderPass_T_*>_>::end
                            (&this->render_passes);
    while (bVar8 = __gnu_cxx::operator!=
                             (&__end2_4,
                              (__normal_iterator<VkRenderPass_T_**,_std::vector<VkRenderPass_T_*,_std::allocator<VkRenderPass_T_*>_>_>
                               *)&render_pass), bVar8) {
      ppVVar14 = __gnu_cxx::
                 __normal_iterator<VkRenderPass_T_**,_std::vector<VkRenderPass_T_*,_std::allocator<VkRenderPass_T_*>_>_>
                 ::operator*(&__end2_4);
      p_Var5 = vkDestroyRenderPass;
      if (*ppVVar14 != (VkRenderPass_T *)0x0) {
        pVVar9 = Fossilize::VulkanDevice::get_device(this->device);
        (*p_Var5)(pVVar9,*ppVVar14,(VkAllocationCallbacks *)0x0);
      }
      __gnu_cxx::
      __normal_iterator<VkRenderPass_T_**,_std::vector<VkRenderPass_T_*,_std::allocator<VkRenderPass_T_*>_>_>
      ::operator++(&__end2_4);
    }
    __end2_5 = std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>::begin
                         (&this->compute_pipelines);
    pipeline = (VkPipeline_T **)
               std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>::end
                         (&this->compute_pipelines);
    while (bVar8 = __gnu_cxx::operator!=
                             (&__end2_5,
                              (__normal_iterator<VkPipeline_T_**,_std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>_>
                               *)&pipeline), bVar8) {
      ppVVar15 = __gnu_cxx::
                 __normal_iterator<VkPipeline_T_**,_std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>_>
                 ::operator*(&__end2_5);
      p_Var2 = vkDestroyPipeline;
      if (*ppVVar15 != (VkPipeline_T *)0x0) {
        pVVar9 = Fossilize::VulkanDevice::get_device(this->device);
        (*p_Var2)(pVVar9,*ppVVar15,(VkAllocationCallbacks *)0x0);
      }
      __gnu_cxx::
      __normal_iterator<VkPipeline_T_**,_std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>_>
      ::operator++(&__end2_5);
    }
    __end2_6 = std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>::begin
                         (&this->graphics_pipelines);
    pipeline_1 = (VkPipeline_T **)
                 std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>::end
                           (&this->graphics_pipelines);
    while (bVar8 = __gnu_cxx::operator!=
                             (&__end2_6,
                              (__normal_iterator<VkPipeline_T_**,_std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>_>
                               *)&pipeline_1), bVar8) {
      ppVVar15 = __gnu_cxx::
                 __normal_iterator<VkPipeline_T_**,_std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>_>
                 ::operator*(&__end2_6);
      p_Var2 = vkDestroyPipeline;
      if (*ppVVar15 != (VkPipeline_T *)0x0) {
        pVVar9 = Fossilize::VulkanDevice::get_device(this->device);
        (*p_Var2)(pVVar9,*ppVVar15,(VkAllocationCallbacks *)0x0);
      }
      __gnu_cxx::
      __normal_iterator<VkPipeline_T_**,_std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>_>
      ::operator++(&__end2_6);
    }
    __end2_7 = std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>::begin
                         (&this->raytracing_pipelines);
    pipeline_2 = (VkPipeline_T **)
                 std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>::end
                           (&this->raytracing_pipelines);
    while (bVar8 = __gnu_cxx::operator!=
                             (&__end2_7,
                              (__normal_iterator<VkPipeline_T_**,_std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>_>
                               *)&pipeline_2), bVar8) {
      ppVVar15 = __gnu_cxx::
                 __normal_iterator<VkPipeline_T_**,_std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>_>
                 ::operator*(&__end2_7);
      p_Var2 = vkDestroyPipeline;
      if (*ppVVar15 != (VkPipeline_T *)0x0) {
        pVVar9 = Fossilize::VulkanDevice::get_device(this->device);
        (*p_Var2)(pVVar9,*ppVVar15,(VkAllocationCallbacks *)0x0);
      }
      __gnu_cxx::
      __normal_iterator<VkPipeline_T_**,_std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>_>
      ::operator++(&__end2_7);
    }
  }
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set(&this->filter_modules);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set(&this->filter_raytracing);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set(&this->filter_compute);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set(&this->filter_graphics);
  std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>::~vector(&this->raytracing_pipelines)
  ;
  std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>::~vector(&this->graphics_pipelines);
  std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>::~vector(&this->compute_pipelines);
  std::vector<VkRenderPass_T_*,_std::allocator<VkRenderPass_T_*>_>::~vector(&this->render_passes);
  std::vector<VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>_>::~vector
            (&this->shader_modules);
  std::vector<VkPipelineLayout_T_*,_std::allocator<VkPipelineLayout_T_*>_>::~vector
            (&this->pipeline_layouts);
  std::vector<VkDescriptorSetLayout_T_*,_std::allocator<VkDescriptorSetLayout_T_*>_>::~vector
            (&this->layouts);
  std::vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>::~vector(&this->samplers);
  std::
  unordered_map<VkShaderModule_T_*,_unsigned_int,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>_>
  ::~unordered_map(&this->module_to_index);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->module_hashes);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->raytracing_hashes);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->compute_hashes);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->graphics_hashes);
  std::
  vector<const_VkRayTracingPipelineCreateInfoKHR_*,_std::allocator<const_VkRayTracingPipelineCreateInfoKHR_*>_>
  ::~vector(&this->raytracing_infos);
  std::
  vector<const_VkComputePipelineCreateInfo_*,_std::allocator<const_VkComputePipelineCreateInfo_*>_>
  ::~vector(&this->compute_infos);
  std::
  vector<const_VkGraphicsPipelineCreateInfo_*,_std::allocator<const_VkGraphicsPipelineCreateInfo_*>_>
  ::~vector(&this->graphics_infos);
  std::vector<const_void_*,_std::allocator<const_void_*>_>::~vector(&this->render_pass_infos);
  std::vector<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>::
  ~vector(&this->shader_module_infos);
  std::
  vector<const_VkPipelineLayoutCreateInfo_*,_std::allocator<const_VkPipelineLayoutCreateInfo_*>_>::
  ~vector(&this->pipeline_layout_infos);
  std::
  vector<const_VkDescriptorSetLayoutCreateInfo_*,_std::allocator<const_VkDescriptorSetLayoutCreateInfo_*>_>
  ::~vector(&this->set_layout_infos);
  std::vector<const_VkSamplerCreateInfo_*,_std::allocator<const_VkSamplerCreateInfo_*>_>::~vector
            (&this->sampler_infos);
  Fossilize::StateCreatorInterface::~StateCreatorInterface(&this->super_StateCreatorInterface);
  return;
}

Assistant:

~DisasmReplayer()
	{
		if (device)
		{
			if (pipeline_cache)
				vkDestroyPipelineCache(device->get_device(), pipeline_cache, nullptr);
			for (auto &sampler : samplers)
				if (sampler)
					vkDestroySampler(device->get_device(), sampler, nullptr);
			for (auto &layout : layouts)
				if (layout)
					vkDestroyDescriptorSetLayout(device->get_device(), layout, nullptr);
			for (auto &pipeline_layout : pipeline_layouts)
				if (pipeline_layout)
					vkDestroyPipelineLayout(device->get_device(), pipeline_layout, nullptr);
			for (auto &shader_module : shader_modules)
				if (shader_module)
					vkDestroyShaderModule(device->get_device(), shader_module, nullptr);
			for (auto &render_pass : render_passes)
				if (render_pass)
					vkDestroyRenderPass(device->get_device(), render_pass, nullptr);
			for (auto &pipeline : compute_pipelines)
				if (pipeline)
					vkDestroyPipeline(device->get_device(), pipeline, nullptr);
			for (auto &pipeline : graphics_pipelines)
				if (pipeline)
					vkDestroyPipeline(device->get_device(), pipeline, nullptr);
			for (auto &pipeline : raytracing_pipelines)
				if (pipeline)
					vkDestroyPipeline(device->get_device(), pipeline, nullptr);
		}
	}